

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_to_uint_map.h
# Opt level: O2

void __thiscall string_to_uint_map::put(string_to_uint_map *this,uint value,char *key)

{
  char *key_00;
  hash_entry *phVar1;
  
  if (value == 0xffffffff) {
    __assert_fail("value != UINT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/string_to_uint_map.h"
                  ,0x8a,"void string_to_uint_map::put(unsigned int, const char *)");
  }
  key_00 = strdup(key);
  phVar1 = _mesa_hash_table_search(this->ht,key_00);
  if (phVar1 != (hash_entry *)0x0) {
    phVar1->data = (void *)(ulong)(value + 1);
    free(key_00);
    return;
  }
  _mesa_hash_table_insert(this->ht,key_00,(void *)(ulong)(value + 1));
  return;
}

Assistant:

void put(unsigned value, const char *key)
   {
      /* The low-level hash table structure returns NULL if key is not in the
       * hash table.  However, users of this map might want to store zero as a
       * valid value in the table.  Bias the value by +1 so that a
       * user-specified zero is stored as 1.  This enables ::get to tell the
       * difference between a user-specified zero (returned as 1 by
       * _mesa_hash_table_search) and the key not in the table (returned as 0 by
       * _mesa_hash_table_search).
       *
       * The net effect is that we can't store UINT_MAX in the table.  This is
       * because UINT_MAX+1 = 0.
       */
      assert(value != UINT_MAX);
      char *dup_key = strdup(key);

      struct hash_entry *entry = _mesa_hash_table_search(this->ht, dup_key);
      if (entry) {
         entry->data = (void *) (intptr_t) (value + 1);
      } else {
         _mesa_hash_table_insert(this->ht, dup_key,
                                 (void *) (intptr_t) (value + 1));
      }

      if (entry)
         free(dup_key);
   }